

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::DoTrackCompoundedIntOverflow(BackwardPass *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,TrackCompoundedIntOverflowPhase,sourceContextId,
                     functionId);
  if ((!bVar1) && (bVar1 = DoTrackIntOverflow(this), bVar1)) {
    bVar1 = Func::IsTrackCompoundedIntOverflowDisabled(this->func);
    return !bVar1;
  }
  return false;
}

Assistant:

bool
BackwardPass::DoTrackCompoundedIntOverflow() const
{
    return
        !PHASE_OFF(Js::TrackCompoundedIntOverflowPhase, func) &&
        DoTrackIntOverflow() && !func->IsTrackCompoundedIntOverflowDisabled();
}